

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old * __thiscall sc_dt::sc_string_old::operator=(sc_string_old *this,char *s)

{
  sc_string_rep *psVar1;
  
  psVar1 = this->rep;
  if (psVar1->ref_count < 2) {
    sc_string_rep::set_string(psVar1,s);
  }
  else {
    psVar1->ref_count = psVar1->ref_count + -1;
    psVar1 = (sc_string_rep *)operator_new(0x10);
    sc_string_rep::sc_string_rep(psVar1,s);
    this->rep = psVar1;
  }
  return this;
}

Assistant:

sc_string_old&
sc_string_old::operator=( const char* s )
{
    if (rep->ref_count > 1) {
        --rep->ref_count;
        rep = new sc_string_rep(s);
    }
    else {
        rep->set_string(s);
    }
    return *this;
}